

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objects.hh
# Opt level: O1

void __thiscall discordpp::MessageCreateEvent::MessageCreateEvent(MessageCreateEvent *this,json *j)

{
  MessageCreateEvent *t;
  pointer *__ptr;
  __uniq_ptr_impl<std::vector<discordpp::ChannelMention,_std::allocator<discordpp::ChannelMention>_>,_std::default_delete<std::vector<discordpp::ChannelMention,_std::allocator<discordpp::ChannelMention>_>_>_>
  local_2c8;
  MessageCreateEvent *local_2c0;
  field<std::vector<discordpp::Snowflake,_std::allocator<discordpp::Snowflake>_>_> local_2b8;
  field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_2a8;
  field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_298;
  field<int> local_288;
  field<bool> local_278;
  field<bool> local_268;
  field<bool> local_258;
  field<discordpp::Snowflake> local_248;
  field<discordpp::Snowflake> local_238;
  undefined1 local_228 [8];
  _Head_base<0UL,_discordpp::MessageInteraction_*,_false> local_220;
  state local_218;
  undefined1 local_210 [8];
  _Head_base<0UL,_discordpp::MessageReference_*,_false> local_208;
  state local_200;
  undefined1 local_1f8 [8];
  _Head_base<0UL,_discordpp::MessageActivity_*,_false> local_1f0;
  state local_1e8;
  undefined1 local_1e0 [8];
  _Head_base<0UL,_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_false>
  local_1d8;
  state local_1d0;
  undefined1 local_1c8 [8];
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_1c0;
  state local_1b8;
  json *local_1b0;
  undefined1 local_1a8 [8];
  _Head_base<0UL,_discordpp::RoleSubscriptionData_*,_false> local_1a0;
  state local_198;
  omittable_field<discordpp::Snowflake> local_190;
  omittable_field<discordpp::Snowflake> local_178;
  field<std::vector<discordpp::Embed,_std::allocator<discordpp::Embed>_>_> local_160;
  field<std::vector<discordpp::Attachment,_std::allocator<discordpp::Attachment>_>_> local_150;
  field<std::vector<discordpp::User,_std::allocator<discordpp::User>_>_> local_140;
  field<discordpp::User> local_130;
  omittable_field<int> local_120;
  omittable_field<int> local_108;
  omittable_field<std::vector<discordpp::Sticker,_std::allocator<discordpp::Sticker>_>_> local_f0;
  omittable_field<std::vector<discordpp::StickerItem,_std::allocator<discordpp::StickerItem>_>_>
  local_d8;
  omittable_field<std::vector<discordpp::Component,_std::allocator<discordpp::Component>_>_>
  local_c0;
  omittable_field<discordpp::Channel> local_a8;
  nullable_omittable_field<discordpp::Message> local_90;
  omittable_field<discordpp::Application> local_78;
  omittable_field<std::vector<discordpp::Reaction,_std::allocator<discordpp::Reaction>_>_> local_60;
  omittable_field<std::vector<discordpp::ChannelMention,_std::allocator<discordpp::ChannelMention>_>_>
  local_48;
  
  local_238.t_._M_t.
  super___uniq_ptr_impl<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_>._M_t.
  super__Tuple_impl<0UL,_discordpp::Snowflake_*,_std::default_delete<discordpp::Snowflake>_>.
  super__Head_base<0UL,_discordpp::Snowflake_*,_false>._M_head_impl =
       (__uniq_ptr_data<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>,_true,_true>
       )(__uniq_ptr_impl<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_>)0x0;
  local_238.s_ = uninitialized_e;
  local_248.t_._M_t.
  super___uniq_ptr_impl<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_>._M_t.
  super__Tuple_impl<0UL,_discordpp::Snowflake_*,_std::default_delete<discordpp::Snowflake>_>.
  super__Head_base<0UL,_discordpp::Snowflake_*,_false>._M_head_impl =
       (__uniq_ptr_data<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>,_true,_true>
       )(__uniq_ptr_impl<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_>)0x0;
  local_248.s_ = uninitialized_e;
  local_130.t_._M_t.super___uniq_ptr_impl<discordpp::User,_std::default_delete<discordpp::User>_>.
  _M_t.super__Tuple_impl<0UL,_discordpp::User_*,_std::default_delete<discordpp::User>_>.
  super__Head_base<0UL,_discordpp::User_*,_false>._M_head_impl =
       (__uniq_ptr_data<discordpp::User,_std::default_delete<discordpp::User>,_true,_true>)
       (__uniq_ptr_impl<discordpp::User,_std::default_delete<discordpp::User>_>)0x0;
  local_130.s_ = uninitialized_e;
  local_298.t_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  local_298.s_ = uninitialized_e;
  local_2a8.t_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  local_2a8.s_ = uninitialized_e;
  local_1c0._M_head_impl = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_1b8 = uninitialized_e;
  local_1c8 = (undefined1  [8])&PTR_operator__0024e100;
  local_258.t_._M_t.super___uniq_ptr_impl<bool,_std::default_delete<bool>_>._M_t.
  super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool>_>.super__Head_base<0UL,_bool_*,_false>.
  _M_head_impl = (__uniq_ptr_data<bool,_std::default_delete<bool>,_true,_true>)
                 (__uniq_ptr_impl<bool,_std::default_delete<bool>_>)0x0;
  local_258.s_ = uninitialized_e;
  local_268.t_._M_t.super___uniq_ptr_impl<bool,_std::default_delete<bool>_>._M_t.
  super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool>_>.super__Head_base<0UL,_bool_*,_false>.
  _M_head_impl = (__uniq_ptr_data<bool,_std::default_delete<bool>,_true,_true>)
                 (__uniq_ptr_impl<bool,_std::default_delete<bool>_>)0x0;
  local_268.s_ = uninitialized_e;
  local_140.t_._M_t.
  super___uniq_ptr_impl<std::vector<discordpp::User,_std::allocator<discordpp::User>_>,_std::default_delete<std::vector<discordpp::User,_std::allocator<discordpp::User>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::vector<discordpp::User,_std::allocator<discordpp::User>_>_*,_std::default_delete<std::vector<discordpp::User,_std::allocator<discordpp::User>_>_>_>
  .super__Head_base<0UL,_std::vector<discordpp::User,_std::allocator<discordpp::User>_>_*,_false>.
  _M_head_impl = (__uniq_ptr_data<std::vector<discordpp::User,_std::allocator<discordpp::User>_>,_std::default_delete<std::vector<discordpp::User,_std::allocator<discordpp::User>_>_>,_true,_true>
                  )(__uniq_ptr_impl<std::vector<discordpp::User,_std::allocator<discordpp::User>_>,_std::default_delete<std::vector<discordpp::User,_std::allocator<discordpp::User>_>_>_>
                    )0x0;
  local_140.s_ = uninitialized_e;
  local_2b8.t_._M_t.
  super___uniq_ptr_impl<std::vector<discordpp::Snowflake,_std::allocator<discordpp::Snowflake>_>,_std::default_delete<std::vector<discordpp::Snowflake,_std::allocator<discordpp::Snowflake>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::vector<discordpp::Snowflake,_std::allocator<discordpp::Snowflake>_>_*,_std::default_delete<std::vector<discordpp::Snowflake,_std::allocator<discordpp::Snowflake>_>_>_>
  .
  super__Head_base<0UL,_std::vector<discordpp::Snowflake,_std::allocator<discordpp::Snowflake>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::vector<discordpp::Snowflake,_std::allocator<discordpp::Snowflake>_>,_std::default_delete<std::vector<discordpp::Snowflake,_std::allocator<discordpp::Snowflake>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::vector<discordpp::Snowflake,_std::allocator<discordpp::Snowflake>_>,_std::default_delete<std::vector<discordpp::Snowflake,_std::allocator<discordpp::Snowflake>_>_>_>
          )0x0;
  local_2b8.s_ = uninitialized_e;
  local_2c8._M_t.
  super__Tuple_impl<0UL,_std::vector<discordpp::ChannelMention,_std::allocator<discordpp::ChannelMention>_>_*,_std::default_delete<std::vector<discordpp::ChannelMention,_std::allocator<discordpp::ChannelMention>_>_>_>
  .
  super__Head_base<0UL,_std::vector<discordpp::ChannelMention,_std::allocator<discordpp::ChannelMention>_>_*,_false>
  ._M_head_impl =
       (tuple<std::vector<discordpp::ChannelMention,_std::allocator<discordpp::ChannelMention>_>_*,_std::default_delete<std::vector<discordpp::ChannelMention,_std::allocator<discordpp::ChannelMention>_>_>_>
        )(_Tuple_impl<0UL,_std::vector<discordpp::ChannelMention,_std::allocator<discordpp::ChannelMention>_>_*,_std::default_delete<std::vector<discordpp::ChannelMention,_std::allocator<discordpp::ChannelMention>_>_>_>
          )0x0;
  local_48.
  super_field<std::vector<discordpp::ChannelMention,_std::allocator<discordpp::ChannelMention>_>_>.
  t_._M_t.
  super___uniq_ptr_impl<std::vector<discordpp::ChannelMention,_std::allocator<discordpp::ChannelMention>_>,_std::default_delete<std::vector<discordpp::ChannelMention,_std::allocator<discordpp::ChannelMention>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::vector<discordpp::ChannelMention,_std::allocator<discordpp::ChannelMention>_>_*,_std::default_delete<std::vector<discordpp::ChannelMention,_std::allocator<discordpp::ChannelMention>_>_>_>
  .
  super__Head_base<0UL,_std::vector<discordpp::ChannelMention,_std::allocator<discordpp::ChannelMention>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::vector<discordpp::ChannelMention,_std::allocator<discordpp::ChannelMention>_>,_std::default_delete<std::vector<discordpp::ChannelMention,_std::allocator<discordpp::ChannelMention>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::vector<discordpp::ChannelMention,_std::allocator<discordpp::ChannelMention>_>,_std::default_delete<std::vector<discordpp::ChannelMention,_std::allocator<discordpp::ChannelMention>_>_>_>
          )0x0;
  local_48.
  super_field<std::vector<discordpp::ChannelMention,_std::allocator<discordpp::ChannelMention>_>_>.
  s_ = omitted_e;
  local_2c0 = this;
  local_1b0 = j;
  std::
  unique_ptr<std::vector<discordpp::ChannelMention,_std::allocator<discordpp::ChannelMention>_>,_std::default_delete<std::vector<discordpp::ChannelMention,_std::allocator<discordpp::ChannelMention>_>_>_>
  ::~unique_ptr((unique_ptr<std::vector<discordpp::ChannelMention,_std::allocator<discordpp::ChannelMention>_>,_std::default_delete<std::vector<discordpp::ChannelMention,_std::allocator<discordpp::ChannelMention>_>_>_>
                 *)&local_2c8);
  local_48._vptr_omittable_field = (_func_int **)&PTR_operator__0024f4f8;
  local_150.t_._M_t.
  super___uniq_ptr_impl<std::vector<discordpp::Attachment,_std::allocator<discordpp::Attachment>_>,_std::default_delete<std::vector<discordpp::Attachment,_std::allocator<discordpp::Attachment>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::vector<discordpp::Attachment,_std::allocator<discordpp::Attachment>_>_*,_std::default_delete<std::vector<discordpp::Attachment,_std::allocator<discordpp::Attachment>_>_>_>
  .
  super__Head_base<0UL,_std::vector<discordpp::Attachment,_std::allocator<discordpp::Attachment>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::vector<discordpp::Attachment,_std::allocator<discordpp::Attachment>_>,_std::default_delete<std::vector<discordpp::Attachment,_std::allocator<discordpp::Attachment>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::vector<discordpp::Attachment,_std::allocator<discordpp::Attachment>_>,_std::default_delete<std::vector<discordpp::Attachment,_std::allocator<discordpp::Attachment>_>_>_>
          )0x0;
  local_150.s_ = uninitialized_e;
  local_160.t_._M_t.
  super___uniq_ptr_impl<std::vector<discordpp::Embed,_std::allocator<discordpp::Embed>_>,_std::default_delete<std::vector<discordpp::Embed,_std::allocator<discordpp::Embed>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::vector<discordpp::Embed,_std::allocator<discordpp::Embed>_>_*,_std::default_delete<std::vector<discordpp::Embed,_std::allocator<discordpp::Embed>_>_>_>
  .super__Head_base<0UL,_std::vector<discordpp::Embed,_std::allocator<discordpp::Embed>_>_*,_false>.
  _M_head_impl = (__uniq_ptr_data<std::vector<discordpp::Embed,_std::allocator<discordpp::Embed>_>,_std::default_delete<std::vector<discordpp::Embed,_std::allocator<discordpp::Embed>_>_>,_true,_true>
                  )(__uniq_ptr_impl<std::vector<discordpp::Embed,_std::allocator<discordpp::Embed>_>,_std::default_delete<std::vector<discordpp::Embed,_std::allocator<discordpp::Embed>_>_>_>
                    )0x0;
  local_160.s_ = uninitialized_e;
  local_2c8._M_t.
  super__Tuple_impl<0UL,_std::vector<discordpp::ChannelMention,_std::allocator<discordpp::ChannelMention>_>_*,_std::default_delete<std::vector<discordpp::ChannelMention,_std::allocator<discordpp::ChannelMention>_>_>_>
  .
  super__Head_base<0UL,_std::vector<discordpp::ChannelMention,_std::allocator<discordpp::ChannelMention>_>_*,_false>
  ._M_head_impl =
       (tuple<std::vector<discordpp::ChannelMention,_std::allocator<discordpp::ChannelMention>_>_*,_std::default_delete<std::vector<discordpp::ChannelMention,_std::allocator<discordpp::ChannelMention>_>_>_>
        )(_Tuple_impl<0UL,_std::vector<discordpp::ChannelMention,_std::allocator<discordpp::ChannelMention>_>_*,_std::default_delete<std::vector<discordpp::ChannelMention,_std::allocator<discordpp::ChannelMention>_>_>_>
          )0x0;
  local_60.super_field<std::vector<discordpp::Reaction,_std::allocator<discordpp::Reaction>_>_>.t_.
  _M_t.
  super___uniq_ptr_impl<std::vector<discordpp::Reaction,_std::allocator<discordpp::Reaction>_>,_std::default_delete<std::vector<discordpp::Reaction,_std::allocator<discordpp::Reaction>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::vector<discordpp::Reaction,_std::allocator<discordpp::Reaction>_>_*,_std::default_delete<std::vector<discordpp::Reaction,_std::allocator<discordpp::Reaction>_>_>_>
  .
  super__Head_base<0UL,_std::vector<discordpp::Reaction,_std::allocator<discordpp::Reaction>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::vector<discordpp::Reaction,_std::allocator<discordpp::Reaction>_>,_std::default_delete<std::vector<discordpp::Reaction,_std::allocator<discordpp::Reaction>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::vector<discordpp::Reaction,_std::allocator<discordpp::Reaction>_>,_std::default_delete<std::vector<discordpp::Reaction,_std::allocator<discordpp::Reaction>_>_>_>
          )0x0;
  local_60.super_field<std::vector<discordpp::Reaction,_std::allocator<discordpp::Reaction>_>_>.s_ =
       omitted_e;
  std::
  unique_ptr<std::vector<discordpp::Reaction,_std::allocator<discordpp::Reaction>_>,_std::default_delete<std::vector<discordpp::Reaction,_std::allocator<discordpp::Reaction>_>_>_>
  ::~unique_ptr((unique_ptr<std::vector<discordpp::Reaction,_std::allocator<discordpp::Reaction>_>,_std::default_delete<std::vector<discordpp::Reaction,_std::allocator<discordpp::Reaction>_>_>_>
                 *)&local_2c8);
  local_60._vptr_omittable_field = (_func_int **)&PTR_operator__0024f778;
  local_1d8._M_head_impl =
       (variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)0x0;
  local_1d0 = omitted_e;
  local_1e0 = (undefined1  [8])&PTR_operator__0024f7c8;
  local_278.t_._M_t.super___uniq_ptr_impl<bool,_std::default_delete<bool>_>._M_t.
  super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool>_>.super__Head_base<0UL,_bool_*,_false>.
  _M_head_impl = (__uniq_ptr_data<bool,_std::default_delete<bool>,_true,_true>)
                 (__uniq_ptr_impl<bool,_std::default_delete<bool>_>)0x0;
  local_278.s_ = uninitialized_e;
  local_178.super_field<discordpp::Snowflake>.t_._M_t.
  super___uniq_ptr_impl<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_>._M_t.
  super__Tuple_impl<0UL,_discordpp::Snowflake_*,_std::default_delete<discordpp::Snowflake>_>.
  super__Head_base<0UL,_discordpp::Snowflake_*,_false>._M_head_impl =
       (__uniq_ptr_data<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>,_true,_true>
       )(__uniq_ptr_impl<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_>)0x0;
  local_178.super_field<discordpp::Snowflake>.s_ = omitted_e;
  local_178._vptr_omittable_field = (_func_int **)&PTR_operator__0024e4e0;
  local_288.t_._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
  super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
  _M_head_impl = (__uniq_ptr_data<int,_std::default_delete<int>,_true,_true>)
                 (__uniq_ptr_impl<int,_std::default_delete<int>_>)0x0;
  local_288.s_ = uninitialized_e;
  local_1f0._M_head_impl = (MessageActivity *)0x0;
  local_1e8 = omitted_e;
  local_1f8 = (undefined1  [8])&PTR_operator__0024f828;
  local_2c8._M_t.
  super__Tuple_impl<0UL,_std::vector<discordpp::ChannelMention,_std::allocator<discordpp::ChannelMention>_>_*,_std::default_delete<std::vector<discordpp::ChannelMention,_std::allocator<discordpp::ChannelMention>_>_>_>
  .
  super__Head_base<0UL,_std::vector<discordpp::ChannelMention,_std::allocator<discordpp::ChannelMention>_>_*,_false>
  ._M_head_impl =
       (tuple<std::vector<discordpp::ChannelMention,_std::allocator<discordpp::ChannelMention>_>_*,_std::default_delete<std::vector<discordpp::ChannelMention,_std::allocator<discordpp::ChannelMention>_>_>_>
        )(_Tuple_impl<0UL,_std::vector<discordpp::ChannelMention,_std::allocator<discordpp::ChannelMention>_>_*,_std::default_delete<std::vector<discordpp::ChannelMention,_std::allocator<discordpp::ChannelMention>_>_>_>
          )0x0;
  local_78.super_field<discordpp::Application>.t_._M_t.
  super___uniq_ptr_impl<discordpp::Application,_std::default_delete<discordpp::Application>_>._M_t.
  super__Tuple_impl<0UL,_discordpp::Application_*,_std::default_delete<discordpp::Application>_>.
  super__Head_base<0UL,_discordpp::Application_*,_false>._M_head_impl =
       (__uniq_ptr_data<discordpp::Application,_std::default_delete<discordpp::Application>,_true,_true>
        )(__uniq_ptr_impl<discordpp::Application,_std::default_delete<discordpp::Application>_>)0x0;
  local_78.super_field<discordpp::Application>.s_ = omitted_e;
  std::unique_ptr<discordpp::Application,_std::default_delete<discordpp::Application>_>::~unique_ptr
            ((unique_ptr<discordpp::Application,_std::default_delete<discordpp::Application>_> *)
             &local_2c8);
  local_78._vptr_omittable_field = (_func_int **)&PTR_operator__0024f878;
  local_190.super_field<discordpp::Snowflake>.t_._M_t.
  super___uniq_ptr_impl<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_>._M_t.
  super__Tuple_impl<0UL,_discordpp::Snowflake_*,_std::default_delete<discordpp::Snowflake>_>.
  super__Head_base<0UL,_discordpp::Snowflake_*,_false>._M_head_impl =
       (__uniq_ptr_data<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>,_true,_true>
       )(__uniq_ptr_impl<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_>)0x0;
  local_190.super_field<discordpp::Snowflake>.s_ = omitted_e;
  local_190._vptr_omittable_field = (_func_int **)&PTR_operator__0024e4e0;
  local_208._M_head_impl = (MessageReference *)0x0;
  local_200 = omitted_e;
  local_210 = (undefined1  [8])&PTR_operator__0024f8c8;
  local_108.super_field<int>.t_._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
  super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
  _M_head_impl = (__uniq_ptr_data<int,_std::default_delete<int>,_true,_true>)
                 (__uniq_ptr_impl<int,_std::default_delete<int>_>)0x0;
  local_108.super_field<int>.s_ = omitted_e;
  local_108._vptr_omittable_field = (_func_int **)&PTR_operator__0024e298;
  local_2c8._M_t.
  super__Tuple_impl<0UL,_std::vector<discordpp::ChannelMention,_std::allocator<discordpp::ChannelMention>_>_*,_std::default_delete<std::vector<discordpp::ChannelMention,_std::allocator<discordpp::ChannelMention>_>_>_>
  .
  super__Head_base<0UL,_std::vector<discordpp::ChannelMention,_std::allocator<discordpp::ChannelMention>_>_*,_false>
  ._M_head_impl =
       (tuple<std::vector<discordpp::ChannelMention,_std::allocator<discordpp::ChannelMention>_>_*,_std::default_delete<std::vector<discordpp::ChannelMention,_std::allocator<discordpp::ChannelMention>_>_>_>
        )(_Tuple_impl<0UL,_std::vector<discordpp::ChannelMention,_std::allocator<discordpp::ChannelMention>_>_*,_std::default_delete<std::vector<discordpp::ChannelMention,_std::allocator<discordpp::ChannelMention>_>_>_>
          )0x0;
  local_90.super_field<discordpp::Message>.t_._M_t.
  super___uniq_ptr_impl<discordpp::Message,_std::default_delete<discordpp::Message>_>._M_t.
  super__Tuple_impl<0UL,_discordpp::Message_*,_std::default_delete<discordpp::Message>_>.
  super__Head_base<0UL,_discordpp::Message_*,_false>._M_head_impl =
       (__uniq_ptr_data<discordpp::Message,_std::default_delete<discordpp::Message>,_true,_true>)
       (__uniq_ptr_impl<discordpp::Message,_std::default_delete<discordpp::Message>_>)0x0;
  local_90.super_field<discordpp::Message>.s_ = omitted_e;
  std::unique_ptr<discordpp::Message,_std::default_delete<discordpp::Message>_>::~unique_ptr
            ((unique_ptr<discordpp::Message,_std::default_delete<discordpp::Message>_> *)&local_2c8)
  ;
  local_90._vptr_nullable_omittable_field = (_func_int **)&PTR_operator__0024f918;
  local_220._M_head_impl = (MessageInteraction *)0x0;
  local_218 = omitted_e;
  local_228 = (undefined1  [8])&PTR_operator__0024f968;
  local_2c8._M_t.
  super__Tuple_impl<0UL,_std::vector<discordpp::ChannelMention,_std::allocator<discordpp::ChannelMention>_>_*,_std::default_delete<std::vector<discordpp::ChannelMention,_std::allocator<discordpp::ChannelMention>_>_>_>
  .
  super__Head_base<0UL,_std::vector<discordpp::ChannelMention,_std::allocator<discordpp::ChannelMention>_>_*,_false>
  ._M_head_impl =
       (tuple<std::vector<discordpp::ChannelMention,_std::allocator<discordpp::ChannelMention>_>_*,_std::default_delete<std::vector<discordpp::ChannelMention,_std::allocator<discordpp::ChannelMention>_>_>_>
        )(_Tuple_impl<0UL,_std::vector<discordpp::ChannelMention,_std::allocator<discordpp::ChannelMention>_>_*,_std::default_delete<std::vector<discordpp::ChannelMention,_std::allocator<discordpp::ChannelMention>_>_>_>
          )0x0;
  local_a8.super_field<discordpp::Channel>.t_._M_t.
  super___uniq_ptr_impl<discordpp::Channel,_std::default_delete<discordpp::Channel>_>._M_t.
  super__Tuple_impl<0UL,_discordpp::Channel_*,_std::default_delete<discordpp::Channel>_>.
  super__Head_base<0UL,_discordpp::Channel_*,_false>._M_head_impl =
       (__uniq_ptr_data<discordpp::Channel,_std::default_delete<discordpp::Channel>,_true,_true>)
       (__uniq_ptr_impl<discordpp::Channel,_std::default_delete<discordpp::Channel>_>)0x0;
  local_a8.super_field<discordpp::Channel>.s_ = omitted_e;
  std::unique_ptr<discordpp::Channel,_std::default_delete<discordpp::Channel>_>::~unique_ptr
            ((unique_ptr<discordpp::Channel,_std::default_delete<discordpp::Channel>_> *)&local_2c8)
  ;
  local_a8._vptr_omittable_field = (_func_int **)&PTR_operator__0024f9b8;
  local_2c8._M_t.
  super__Tuple_impl<0UL,_std::vector<discordpp::ChannelMention,_std::allocator<discordpp::ChannelMention>_>_*,_std::default_delete<std::vector<discordpp::ChannelMention,_std::allocator<discordpp::ChannelMention>_>_>_>
  .
  super__Head_base<0UL,_std::vector<discordpp::ChannelMention,_std::allocator<discordpp::ChannelMention>_>_*,_false>
  ._M_head_impl =
       (tuple<std::vector<discordpp::ChannelMention,_std::allocator<discordpp::ChannelMention>_>_*,_std::default_delete<std::vector<discordpp::ChannelMention,_std::allocator<discordpp::ChannelMention>_>_>_>
        )(_Tuple_impl<0UL,_std::vector<discordpp::ChannelMention,_std::allocator<discordpp::ChannelMention>_>_*,_std::default_delete<std::vector<discordpp::ChannelMention,_std::allocator<discordpp::ChannelMention>_>_>_>
          )0x0;
  local_c0.super_field<std::vector<discordpp::Component,_std::allocator<discordpp::Component>_>_>.t_
  ._M_t.
  super___uniq_ptr_impl<std::vector<discordpp::Component,_std::allocator<discordpp::Component>_>,_std::default_delete<std::vector<discordpp::Component,_std::allocator<discordpp::Component>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::vector<discordpp::Component,_std::allocator<discordpp::Component>_>_*,_std::default_delete<std::vector<discordpp::Component,_std::allocator<discordpp::Component>_>_>_>
  .
  super__Head_base<0UL,_std::vector<discordpp::Component,_std::allocator<discordpp::Component>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::vector<discordpp::Component,_std::allocator<discordpp::Component>_>,_std::default_delete<std::vector<discordpp::Component,_std::allocator<discordpp::Component>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::vector<discordpp::Component,_std::allocator<discordpp::Component>_>,_std::default_delete<std::vector<discordpp::Component,_std::allocator<discordpp::Component>_>_>_>
          )0x0;
  local_c0.super_field<std::vector<discordpp::Component,_std::allocator<discordpp::Component>_>_>.s_
       = omitted_e;
  std::
  unique_ptr<std::vector<discordpp::Component,_std::allocator<discordpp::Component>_>,_std::default_delete<std::vector<discordpp::Component,_std::allocator<discordpp::Component>_>_>_>
  ::~unique_ptr((unique_ptr<std::vector<discordpp::Component,_std::allocator<discordpp::Component>_>,_std::default_delete<std::vector<discordpp::Component,_std::allocator<discordpp::Component>_>_>_>
                 *)&local_2c8);
  local_c0._vptr_omittable_field = (_func_int **)&PTR_operator__0024fa08;
  local_2c8._M_t.
  super__Tuple_impl<0UL,_std::vector<discordpp::ChannelMention,_std::allocator<discordpp::ChannelMention>_>_*,_std::default_delete<std::vector<discordpp::ChannelMention,_std::allocator<discordpp::ChannelMention>_>_>_>
  .
  super__Head_base<0UL,_std::vector<discordpp::ChannelMention,_std::allocator<discordpp::ChannelMention>_>_*,_false>
  ._M_head_impl =
       (tuple<std::vector<discordpp::ChannelMention,_std::allocator<discordpp::ChannelMention>_>_*,_std::default_delete<std::vector<discordpp::ChannelMention,_std::allocator<discordpp::ChannelMention>_>_>_>
        )(_Tuple_impl<0UL,_std::vector<discordpp::ChannelMention,_std::allocator<discordpp::ChannelMention>_>_*,_std::default_delete<std::vector<discordpp::ChannelMention,_std::allocator<discordpp::ChannelMention>_>_>_>
          )0x0;
  local_d8.
  super_field<std::vector<discordpp::StickerItem,_std::allocator<discordpp::StickerItem>_>_>.t_._M_t
  .
  super___uniq_ptr_impl<std::vector<discordpp::StickerItem,_std::allocator<discordpp::StickerItem>_>,_std::default_delete<std::vector<discordpp::StickerItem,_std::allocator<discordpp::StickerItem>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::vector<discordpp::StickerItem,_std::allocator<discordpp::StickerItem>_>_*,_std::default_delete<std::vector<discordpp::StickerItem,_std::allocator<discordpp::StickerItem>_>_>_>
  .
  super__Head_base<0UL,_std::vector<discordpp::StickerItem,_std::allocator<discordpp::StickerItem>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::vector<discordpp::StickerItem,_std::allocator<discordpp::StickerItem>_>,_std::default_delete<std::vector<discordpp::StickerItem,_std::allocator<discordpp::StickerItem>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::vector<discordpp::StickerItem,_std::allocator<discordpp::StickerItem>_>,_std::default_delete<std::vector<discordpp::StickerItem,_std::allocator<discordpp::StickerItem>_>_>_>
          )0x0;
  local_d8.
  super_field<std::vector<discordpp::StickerItem,_std::allocator<discordpp::StickerItem>_>_>.s_ =
       omitted_e;
  std::
  unique_ptr<std::vector<discordpp::StickerItem,_std::allocator<discordpp::StickerItem>_>,_std::default_delete<std::vector<discordpp::StickerItem,_std::allocator<discordpp::StickerItem>_>_>_>
  ::~unique_ptr((unique_ptr<std::vector<discordpp::StickerItem,_std::allocator<discordpp::StickerItem>_>,_std::default_delete<std::vector<discordpp::StickerItem,_std::allocator<discordpp::StickerItem>_>_>_>
                 *)&local_2c8);
  local_d8._vptr_omittable_field = (_func_int **)&PTR_operator__0024fa58;
  local_2c8._M_t.
  super__Tuple_impl<0UL,_std::vector<discordpp::ChannelMention,_std::allocator<discordpp::ChannelMention>_>_*,_std::default_delete<std::vector<discordpp::ChannelMention,_std::allocator<discordpp::ChannelMention>_>_>_>
  .
  super__Head_base<0UL,_std::vector<discordpp::ChannelMention,_std::allocator<discordpp::ChannelMention>_>_*,_false>
  ._M_head_impl =
       (tuple<std::vector<discordpp::ChannelMention,_std::allocator<discordpp::ChannelMention>_>_*,_std::default_delete<std::vector<discordpp::ChannelMention,_std::allocator<discordpp::ChannelMention>_>_>_>
        )(_Tuple_impl<0UL,_std::vector<discordpp::ChannelMention,_std::allocator<discordpp::ChannelMention>_>_*,_std::default_delete<std::vector<discordpp::ChannelMention,_std::allocator<discordpp::ChannelMention>_>_>_>
          )0x0;
  local_f0.super_field<std::vector<discordpp::Sticker,_std::allocator<discordpp::Sticker>_>_>.t_.
  _M_t.
  super___uniq_ptr_impl<std::vector<discordpp::Sticker,_std::allocator<discordpp::Sticker>_>,_std::default_delete<std::vector<discordpp::Sticker,_std::allocator<discordpp::Sticker>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::vector<discordpp::Sticker,_std::allocator<discordpp::Sticker>_>_*,_std::default_delete<std::vector<discordpp::Sticker,_std::allocator<discordpp::Sticker>_>_>_>
  .
  super__Head_base<0UL,_std::vector<discordpp::Sticker,_std::allocator<discordpp::Sticker>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::vector<discordpp::Sticker,_std::allocator<discordpp::Sticker>_>,_std::default_delete<std::vector<discordpp::Sticker,_std::allocator<discordpp::Sticker>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::vector<discordpp::Sticker,_std::allocator<discordpp::Sticker>_>,_std::default_delete<std::vector<discordpp::Sticker,_std::allocator<discordpp::Sticker>_>_>_>
          )0x0;
  local_f0.super_field<std::vector<discordpp::Sticker,_std::allocator<discordpp::Sticker>_>_>.s_ =
       omitted_e;
  std::
  unique_ptr<std::vector<discordpp::Sticker,_std::allocator<discordpp::Sticker>_>,_std::default_delete<std::vector<discordpp::Sticker,_std::allocator<discordpp::Sticker>_>_>_>
  ::~unique_ptr((unique_ptr<std::vector<discordpp::Sticker,_std::allocator<discordpp::Sticker>_>,_std::default_delete<std::vector<discordpp::Sticker,_std::allocator<discordpp::Sticker>_>_>_>
                 *)&local_2c8);
  local_f0._vptr_omittable_field = (_func_int **)&PTR_operator__0024e660;
  local_120.super_field<int>.t_._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
  super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
  _M_head_impl = (__uniq_ptr_data<int,_std::default_delete<int>,_true,_true>)
                 (__uniq_ptr_impl<int,_std::default_delete<int>_>)0x0;
  local_120.super_field<int>.s_ = omitted_e;
  local_120._vptr_omittable_field = (_func_int **)&PTR_operator__0024e298;
  local_1a0._M_head_impl = (RoleSubscriptionData *)0x0;
  local_198 = omitted_e;
  local_1a8 = (undefined1  [8])&PTR_operator__0024faa8;
  Message::Message(&local_2c0->super_Message,&local_238,&local_248,&local_130,&local_298,&local_2a8,
                   (nullable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_1c8,&local_258,&local_268,&local_140,&local_2b8,&local_48,&local_150,
                   &local_160,&local_60,
                   (omittable_field<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_1e0,&local_278,&local_178,&local_288,
                   (omittable_field<discordpp::MessageActivity> *)local_1f8,&local_78,&local_190,
                   (omittable_field<discordpp::MessageReference> *)local_210,&local_108,&local_90,
                   (omittable_field<discordpp::MessageInteraction> *)local_228,&local_a8,&local_c0,
                   &local_d8,&local_f0,&local_120,
                   (omittable_field<discordpp::RoleSubscriptionData> *)local_1a8);
  if ((_Head_base<0UL,_discordpp::RoleSubscriptionData_*,_false>)local_1a0._M_head_impl !=
      (_Head_base<0UL,_discordpp::RoleSubscriptionData_*,_false>)0x0) {
    std::default_delete<discordpp::RoleSubscriptionData>::operator()
              ((default_delete<discordpp::RoleSubscriptionData> *)&local_1a0,local_1a0._M_head_impl)
    ;
  }
  t = local_2c0;
  local_1a0._M_head_impl = (RoleSubscriptionData *)0x0;
  if ((_Tuple_impl<0UL,_int_*,_std::default_delete<int>_>)
      local_120.super_field<int>.t_._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
      super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
      _M_head_impl != (int *)0x0) {
    operator_delete((void *)local_120.super_field<int>.t_._M_t.
                            super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
                            super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
                            super__Head_base<0UL,_int_*,_false>._M_head_impl,4);
  }
  local_120.super_field<int>.t_._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
  super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
  _M_head_impl = (__uniq_ptr_data<int,_std::default_delete<int>,_true,_true>)
                 (__uniq_ptr_impl<int,_std::default_delete<int>_>)0x0;
  std::
  unique_ptr<std::vector<discordpp::Sticker,_std::allocator<discordpp::Sticker>_>,_std::default_delete<std::vector<discordpp::Sticker,_std::allocator<discordpp::Sticker>_>_>_>
  ::~unique_ptr(&local_f0.
                 super_field<std::vector<discordpp::Sticker,_std::allocator<discordpp::Sticker>_>_>.
                 t_);
  std::
  unique_ptr<std::vector<discordpp::StickerItem,_std::allocator<discordpp::StickerItem>_>,_std::default_delete<std::vector<discordpp::StickerItem,_std::allocator<discordpp::StickerItem>_>_>_>
  ::~unique_ptr(&local_d8.
                 super_field<std::vector<discordpp::StickerItem,_std::allocator<discordpp::StickerItem>_>_>
                 .t_);
  std::
  unique_ptr<std::vector<discordpp::Component,_std::allocator<discordpp::Component>_>,_std::default_delete<std::vector<discordpp::Component,_std::allocator<discordpp::Component>_>_>_>
  ::~unique_ptr(&local_c0.
                 super_field<std::vector<discordpp::Component,_std::allocator<discordpp::Component>_>_>
                 .t_);
  std::unique_ptr<discordpp::Channel,_std::default_delete<discordpp::Channel>_>::~unique_ptr
            (&local_a8.super_field<discordpp::Channel>.t_);
  if ((_Tuple_impl<0UL,_discordpp::MessageInteraction_*,_std::default_delete<discordpp::MessageInteraction>_>
       )local_220._M_head_impl != (MessageInteraction *)0x0) {
    std::default_delete<discordpp::MessageInteraction>::operator()
              ((default_delete<discordpp::MessageInteraction> *)&local_220,local_220._M_head_impl);
  }
  local_220._M_head_impl = (MessageInteraction *)0x0;
  std::unique_ptr<discordpp::Message,_std::default_delete<discordpp::Message>_>::~unique_ptr
            (&local_90.super_field<discordpp::Message>.t_);
  if ((_Tuple_impl<0UL,_int_*,_std::default_delete<int>_>)
      local_108.super_field<int>.t_._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
      super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
      _M_head_impl != (int *)0x0) {
    operator_delete((void *)local_108.super_field<int>.t_._M_t.
                            super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
                            super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
                            super__Head_base<0UL,_int_*,_false>._M_head_impl,4);
  }
  local_108.super_field<int>.t_._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
  super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
  _M_head_impl = (__uniq_ptr_data<int,_std::default_delete<int>,_true,_true>)
                 (__uniq_ptr_impl<int,_std::default_delete<int>_>)0x0;
  if (local_208._M_head_impl != (MessageReference *)0x0) {
    std::default_delete<discordpp::MessageReference>::operator()
              ((default_delete<discordpp::MessageReference> *)&local_208,local_208._M_head_impl);
  }
  local_208._M_head_impl = (MessageReference *)0x0;
  if (local_190.super_field<discordpp::Snowflake>.t_._M_t.
      super___uniq_ptr_impl<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_>._M_t.
      super__Tuple_impl<0UL,_discordpp::Snowflake_*,_std::default_delete<discordpp::Snowflake>_>.
      super__Head_base<0UL,_discordpp::Snowflake_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_>)0x0) {
    operator_delete((void *)local_190.super_field<discordpp::Snowflake>.t_._M_t.
                            super___uniq_ptr_impl<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_discordpp::Snowflake_*,_std::default_delete<discordpp::Snowflake>_>
                            .super__Head_base<0UL,_discordpp::Snowflake_*,_false>._M_head_impl,8);
  }
  local_190.super_field<discordpp::Snowflake>.t_._M_t.
  super___uniq_ptr_impl<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_>._M_t.
  super__Tuple_impl<0UL,_discordpp::Snowflake_*,_std::default_delete<discordpp::Snowflake>_>.
  super__Head_base<0UL,_discordpp::Snowflake_*,_false>._M_head_impl =
       (__uniq_ptr_data<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>,_true,_true>
       )(__uniq_ptr_impl<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_>)0x0;
  std::unique_ptr<discordpp::Application,_std::default_delete<discordpp::Application>_>::~unique_ptr
            (&local_78.super_field<discordpp::Application>.t_);
  if ((_Tuple_impl<0UL,_discordpp::MessageActivity_*,_std::default_delete<discordpp::MessageActivity>_>
       )local_1f0._M_head_impl != (MessageActivity *)0x0) {
    std::default_delete<discordpp::MessageActivity>::operator()
              ((default_delete<discordpp::MessageActivity> *)&local_1f0,local_1f0._M_head_impl);
  }
  local_1f0._M_head_impl = (MessageActivity *)0x0;
  if (local_288.t_._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
      super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
      _M_head_impl != (__uniq_ptr_impl<int,_std::default_delete<int>_>)0x0) {
    operator_delete((void *)local_288.t_._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>.
                            _M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
                            super__Head_base<0UL,_int_*,_false>._M_head_impl,4);
  }
  local_288.t_._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
  super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
  _M_head_impl = (__uniq_ptr_data<int,_std::default_delete<int>,_true,_true>)
                 (__uniq_ptr_impl<int,_std::default_delete<int>_>)0x0;
  if (local_178.super_field<discordpp::Snowflake>.t_._M_t.
      super___uniq_ptr_impl<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_>._M_t.
      super__Tuple_impl<0UL,_discordpp::Snowflake_*,_std::default_delete<discordpp::Snowflake>_>.
      super__Head_base<0UL,_discordpp::Snowflake_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_>)0x0) {
    operator_delete((void *)local_178.super_field<discordpp::Snowflake>.t_._M_t.
                            super___uniq_ptr_impl<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_discordpp::Snowflake_*,_std::default_delete<discordpp::Snowflake>_>
                            .super__Head_base<0UL,_discordpp::Snowflake_*,_false>._M_head_impl,8);
  }
  local_178.super_field<discordpp::Snowflake>.t_._M_t.
  super___uniq_ptr_impl<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_>._M_t.
  super__Tuple_impl<0UL,_discordpp::Snowflake_*,_std::default_delete<discordpp::Snowflake>_>.
  super__Head_base<0UL,_discordpp::Snowflake_*,_false>._M_head_impl =
       (__uniq_ptr_data<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>,_true,_true>
       )(__uniq_ptr_impl<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_>)0x0;
  if (local_278.t_._M_t.super___uniq_ptr_impl<bool,_std::default_delete<bool>_>._M_t.
      super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool>_>.
      super__Head_base<0UL,_bool_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<bool,_std::default_delete<bool>_>)0x0) {
    operator_delete((void *)local_278.t_._M_t.
                            super___uniq_ptr_impl<bool,_std::default_delete<bool>_>._M_t.
                            super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool>_>.
                            super__Head_base<0UL,_bool_*,_false>._M_head_impl,1);
  }
  local_278.t_._M_t.super___uniq_ptr_impl<bool,_std::default_delete<bool>_>._M_t.
  super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool>_>.super__Head_base<0UL,_bool_*,_false>.
  _M_head_impl = (__uniq_ptr_data<bool,_std::default_delete<bool>,_true,_true>)
                 (__uniq_ptr_impl<bool,_std::default_delete<bool>_>)0x0;
  if ((_Head_base<0UL,_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_false>
       )local_1d8._M_head_impl !=
      (_Head_base<0UL,_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_false>
       )0x0) {
    std::
    default_delete<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator()((default_delete<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_1d8,local_1d8._M_head_impl);
  }
  local_1d8._M_head_impl =
       (variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)0x0;
  std::
  unique_ptr<std::vector<discordpp::Reaction,_std::allocator<discordpp::Reaction>_>,_std::default_delete<std::vector<discordpp::Reaction,_std::allocator<discordpp::Reaction>_>_>_>
  ::~unique_ptr(&local_60.
                 super_field<std::vector<discordpp::Reaction,_std::allocator<discordpp::Reaction>_>_>
                 .t_);
  std::
  unique_ptr<std::vector<discordpp::Embed,_std::allocator<discordpp::Embed>_>,_std::default_delete<std::vector<discordpp::Embed,_std::allocator<discordpp::Embed>_>_>_>
  ::~unique_ptr(&local_160.t_);
  std::
  unique_ptr<std::vector<discordpp::Attachment,_std::allocator<discordpp::Attachment>_>,_std::default_delete<std::vector<discordpp::Attachment,_std::allocator<discordpp::Attachment>_>_>_>
  ::~unique_ptr(&local_150.t_);
  std::
  unique_ptr<std::vector<discordpp::ChannelMention,_std::allocator<discordpp::ChannelMention>_>,_std::default_delete<std::vector<discordpp::ChannelMention,_std::allocator<discordpp::ChannelMention>_>_>_>
  ::~unique_ptr(&local_48.
                 super_field<std::vector<discordpp::ChannelMention,_std::allocator<discordpp::ChannelMention>_>_>
                 .t_);
  if ((_Tuple_impl<0UL,_std::vector<discordpp::Snowflake,_std::allocator<discordpp::Snowflake>_>_*,_std::default_delete<std::vector<discordpp::Snowflake,_std::allocator<discordpp::Snowflake>_>_>_>
       )local_2b8.t_._M_t.
        super___uniq_ptr_impl<std::vector<discordpp::Snowflake,_std::allocator<discordpp::Snowflake>_>,_std::default_delete<std::vector<discordpp::Snowflake,_std::allocator<discordpp::Snowflake>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::vector<discordpp::Snowflake,_std::allocator<discordpp::Snowflake>_>_*,_std::default_delete<std::vector<discordpp::Snowflake,_std::allocator<discordpp::Snowflake>_>_>_>
        .
        super__Head_base<0UL,_std::vector<discordpp::Snowflake,_std::allocator<discordpp::Snowflake>_>_*,_false>
        ._M_head_impl != (vector<discordpp::Snowflake,_std::allocator<discordpp::Snowflake>_> *)0x0)
  {
    std::default_delete<std::vector<discordpp::Snowflake,_std::allocator<discordpp::Snowflake>_>_>::
    operator()((default_delete<std::vector<discordpp::Snowflake,_std::allocator<discordpp::Snowflake>_>_>
                *)&local_2b8,
               (vector<discordpp::Snowflake,_std::allocator<discordpp::Snowflake>_> *)
               local_2b8.t_._M_t.
               super___uniq_ptr_impl<std::vector<discordpp::Snowflake,_std::allocator<discordpp::Snowflake>_>,_std::default_delete<std::vector<discordpp::Snowflake,_std::allocator<discordpp::Snowflake>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::vector<discordpp::Snowflake,_std::allocator<discordpp::Snowflake>_>_*,_std::default_delete<std::vector<discordpp::Snowflake,_std::allocator<discordpp::Snowflake>_>_>_>
               .
               super__Head_base<0UL,_std::vector<discordpp::Snowflake,_std::allocator<discordpp::Snowflake>_>_*,_false>
               ._M_head_impl);
  }
  local_2b8.t_._M_t.
  super___uniq_ptr_impl<std::vector<discordpp::Snowflake,_std::allocator<discordpp::Snowflake>_>,_std::default_delete<std::vector<discordpp::Snowflake,_std::allocator<discordpp::Snowflake>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::vector<discordpp::Snowflake,_std::allocator<discordpp::Snowflake>_>_*,_std::default_delete<std::vector<discordpp::Snowflake,_std::allocator<discordpp::Snowflake>_>_>_>
  .
  super__Head_base<0UL,_std::vector<discordpp::Snowflake,_std::allocator<discordpp::Snowflake>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::vector<discordpp::Snowflake,_std::allocator<discordpp::Snowflake>_>,_std::default_delete<std::vector<discordpp::Snowflake,_std::allocator<discordpp::Snowflake>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::vector<discordpp::Snowflake,_std::allocator<discordpp::Snowflake>_>,_std::default_delete<std::vector<discordpp::Snowflake,_std::allocator<discordpp::Snowflake>_>_>_>
          )0x0;
  std::
  unique_ptr<std::vector<discordpp::User,_std::allocator<discordpp::User>_>,_std::default_delete<std::vector<discordpp::User,_std::allocator<discordpp::User>_>_>_>
  ::~unique_ptr(&local_140.t_);
  if (local_268.t_._M_t.super___uniq_ptr_impl<bool,_std::default_delete<bool>_>._M_t.
      super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool>_>.
      super__Head_base<0UL,_bool_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<bool,_std::default_delete<bool>_>)0x0) {
    operator_delete((void *)local_268.t_._M_t.
                            super___uniq_ptr_impl<bool,_std::default_delete<bool>_>._M_t.
                            super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool>_>.
                            super__Head_base<0UL,_bool_*,_false>._M_head_impl,1);
  }
  local_268.t_._M_t.super___uniq_ptr_impl<bool,_std::default_delete<bool>_>._M_t.
  super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool>_>.super__Head_base<0UL,_bool_*,_false>.
  _M_head_impl = (__uniq_ptr_data<bool,_std::default_delete<bool>,_true,_true>)
                 (__uniq_ptr_impl<bool,_std::default_delete<bool>_>)0x0;
  if (local_258.t_._M_t.super___uniq_ptr_impl<bool,_std::default_delete<bool>_>._M_t.
      super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool>_>.
      super__Head_base<0UL,_bool_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<bool,_std::default_delete<bool>_>)0x0) {
    operator_delete((void *)local_258.t_._M_t.
                            super___uniq_ptr_impl<bool,_std::default_delete<bool>_>._M_t.
                            super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool>_>.
                            super__Head_base<0UL,_bool_*,_false>._M_head_impl,1);
  }
  local_258.t_._M_t.super___uniq_ptr_impl<bool,_std::default_delete<bool>_>._M_t.
  super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool>_>.super__Head_base<0UL,_bool_*,_false>.
  _M_head_impl = (__uniq_ptr_data<bool,_std::default_delete<bool>,_true,_true>)
                 (__uniq_ptr_impl<bool,_std::default_delete<bool>_>)0x0;
  if ((_Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       )local_1c0._M_head_impl !=
      (_Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       )0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1c0,local_1c0._M_head_impl);
  }
  local_1c0._M_head_impl = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )local_2a8.t_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_2a8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_2a8.t_._M_t.
                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl);
  }
  local_2a8.t_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (local_298.t_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl !=
      (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_298,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_298.t_._M_t.
                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl);
  }
  local_298.t_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::unique_ptr<discordpp::User,_std::default_delete<discordpp::User>_>::~unique_ptr
            (&local_130.t_);
  if (local_248.t_._M_t.
      super___uniq_ptr_impl<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_>._M_t.
      super__Tuple_impl<0UL,_discordpp::Snowflake_*,_std::default_delete<discordpp::Snowflake>_>.
      super__Head_base<0UL,_discordpp::Snowflake_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_>)0x0) {
    operator_delete((void *)local_248.t_._M_t.
                            super___uniq_ptr_impl<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_discordpp::Snowflake_*,_std::default_delete<discordpp::Snowflake>_>
                            .super__Head_base<0UL,_discordpp::Snowflake_*,_false>._M_head_impl,8);
  }
  local_248.t_._M_t.
  super___uniq_ptr_impl<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_>._M_t.
  super__Tuple_impl<0UL,_discordpp::Snowflake_*,_std::default_delete<discordpp::Snowflake>_>.
  super__Head_base<0UL,_discordpp::Snowflake_*,_false>._M_head_impl =
       (__uniq_ptr_data<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>,_true,_true>
       )(__uniq_ptr_impl<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_>)0x0;
  if ((_Head_base<0UL,_discordpp::Snowflake_*,_false>)
      local_238.t_._M_t.
      super___uniq_ptr_impl<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_>._M_t.
      super__Tuple_impl<0UL,_discordpp::Snowflake_*,_std::default_delete<discordpp::Snowflake>_>.
      super__Head_base<0UL,_discordpp::Snowflake_*,_false>._M_head_impl !=
      (_Head_base<0UL,_discordpp::Snowflake_*,_false>)0x0) {
    operator_delete((void *)local_238.t_._M_t.
                            super___uniq_ptr_impl<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_discordpp::Snowflake_*,_std::default_delete<discordpp::Snowflake>_>
                            .super__Head_base<0UL,_discordpp::Snowflake_*,_false>._M_head_impl,8);
  }
  local_238.t_._M_t.
  super___uniq_ptr_impl<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_>._M_t.
  super__Tuple_impl<0UL,_discordpp::Snowflake_*,_std::default_delete<discordpp::Snowflake>_>.
  super__Head_base<0UL,_discordpp::Snowflake_*,_false>._M_head_impl =
       (__uniq_ptr_data<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>,_true,_true>
       )(__uniq_ptr_impl<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_>)0x0;
  (t->guild_id).super_field<discordpp::Snowflake>.t_._M_t.
  super___uniq_ptr_impl<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_>._M_t.
  super__Tuple_impl<0UL,_discordpp::Snowflake_*,_std::default_delete<discordpp::Snowflake>_>.
  super__Head_base<0UL,_discordpp::Snowflake_*,_false>._M_head_impl = (Snowflake *)0x0;
  (t->guild_id).super_field<discordpp::Snowflake>.s_ = omitted_e;
  (t->guild_id)._vptr_omittable_field = (_func_int **)&PTR_operator__0024e4e0;
  (t->member).super_field<discordpp::GuildMember>.t_._M_t.
  super___uniq_ptr_impl<discordpp::GuildMember,_std::default_delete<discordpp::GuildMember>_>._M_t.
  super__Tuple_impl<0UL,_discordpp::GuildMember_*,_std::default_delete<discordpp::GuildMember>_>.
  super__Head_base<0UL,_discordpp::GuildMember_*,_false>._M_head_impl = (GuildMember *)0x0;
  local_2c8._M_t.
  super__Tuple_impl<0UL,_std::vector<discordpp::ChannelMention,_std::allocator<discordpp::ChannelMention>_>_*,_std::default_delete<std::vector<discordpp::ChannelMention,_std::allocator<discordpp::ChannelMention>_>_>_>
  .
  super__Head_base<0UL,_std::vector<discordpp::ChannelMention,_std::allocator<discordpp::ChannelMention>_>_*,_false>
  ._M_head_impl =
       (tuple<std::vector<discordpp::ChannelMention,_std::allocator<discordpp::ChannelMention>_>_*,_std::default_delete<std::vector<discordpp::ChannelMention,_std::allocator<discordpp::ChannelMention>_>_>_>
        )(_Tuple_impl<0UL,_std::vector<discordpp::ChannelMention,_std::allocator<discordpp::ChannelMention>_>_*,_std::default_delete<std::vector<discordpp::ChannelMention,_std::allocator<discordpp::ChannelMention>_>_>_>
          )0x0;
  (t->member).super_field<discordpp::GuildMember>.s_ = omitted_e;
  std::unique_ptr<discordpp::GuildMember,_std::default_delete<discordpp::GuildMember>_>::~unique_ptr
            ((unique_ptr<discordpp::GuildMember,_std::default_delete<discordpp::GuildMember>_> *)
             &local_2c8);
  (t->member)._vptr_omittable_field = (_func_int **)&PTR_operator__0024efe8;
  discordpp::from_json(local_1b0,t);
  return;
}

Assistant:

MessageCreateEvent(const json &j) { from_json(j, *this); }